

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O0

QDomDocumentPrivate * __thiscall QDomNodePrivate::ownerDocument(QDomNodePrivate *this)

{
  bool bVar1;
  QDomDocumentPrivate *in_RDI;
  QDomNodePrivate *p;
  byte local_19;
  QDomDocumentPrivate *local_18;
  
  local_18 = in_RDI;
  while( true ) {
    local_19 = 0;
    if (local_18 != (QDomDocumentPrivate *)0x0) {
      bVar1 = isDocument((QDomNodePrivate *)0x10de4f);
      local_19 = bVar1 ^ 0xff;
    }
    if ((local_19 & 1) == 0) break;
    if (((byte)(local_18->super_QDomNodePrivate).field_0x98 >> 1 & 1) == 0) {
      return (QDomDocumentPrivate *)(local_18->super_QDomNodePrivate).ownerNode;
    }
    local_18 = (QDomDocumentPrivate *)parent(&local_18->super_QDomNodePrivate);
  }
  return local_18;
}

Assistant:

QDomDocumentPrivate* QDomNodePrivate::ownerDocument()
{
    QDomNodePrivate* p = this;
    while (p && !p->isDocument()) {
        if (!p->hasParent)
            return static_cast<QDomDocumentPrivate *>(p->ownerNode);
        p = p->parent();
    }

    return static_cast<QDomDocumentPrivate *>(p);
}